

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O1

void __thiscall
icu_63::SharedDateFormatSymbols::~SharedDateFormatSymbols(SharedDateFormatSymbols *this)

{
  void *in_RSI;
  
  (this->super_SharedObject).super_UObject._vptr_UObject =
       (_func_int **)&PTR__SharedDateFormatSymbols_0047d4d0;
  DateFormatSymbols::~DateFormatSymbols(&this->dfs);
  SharedObject::~SharedObject(&this->super_SharedObject);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

U_I18N_API
const SharedDateFormatSymbols *
        LocaleCacheKey<SharedDateFormatSymbols>::createObject(
                const void * /*unusedContext*/, UErrorCode &status) const {
    char type[256];
    Calendar::getCalendarTypeFromLocale(fLoc, type, UPRV_LENGTHOF(type), status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    SharedDateFormatSymbols *shared
            = new SharedDateFormatSymbols(fLoc, type, status);
    if (shared == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    if (U_FAILURE(status)) {
        delete shared;
        return NULL;
    }
    shared->addRef();
    return shared;
}